

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O0

string * muduo::formatIEC_abi_cxx11_(int64_t s)

{
  long in_RSI;
  string *in_RDI;
  double Ei;
  double Pi;
  double Ti;
  double Gi;
  double Mi;
  double Ki;
  char buf [64];
  double n;
  allocator local_89;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  char local_58 [64];
  double local_18;
  
  local_18 = (double)in_RSI;
  local_60 = 0x4090000000000000;
  local_68 = 0x4130000000000000;
  local_70 = 0x41d0000000000000;
  local_78 = 0x4270000000000000;
  local_80 = 0x4310000000000000;
  local_88 = 0x43b0000000000000;
  if (1024.0 <= local_18) {
    if (10234.88 <= local_18) {
      if (102348.8 <= local_18) {
        if (1048064.0 <= local_18) {
          if (10480517.12 <= local_18) {
            if (104805171.2 <= local_18) {
              if (1073217536.0 <= local_18) {
                if (10732049530.88 <= local_18) {
                  if (107320495308.8 <= local_18) {
                    if (1098974756864.0 <= local_18) {
                      if (10989618719621.12 <= local_18) {
                        if (109896187196211.2 <= local_18) {
                          if (1125350151028736.0 <= local_18) {
                            if (11253369568892026.0 <= local_18) {
                              if (1.1253369568892027e+17 <= local_18) {
                                if (1.1523585546534257e+18 <= local_18) {
                                  if (1.1523450438545435e+19 <= local_18) {
                                    snprintf(local_58,0x40,"%.1fEi",local_18 / 1.152921504606847e+18
                                            );
                                  }
                                  else {
                                    snprintf(local_58,0x40,"%.2fEi",local_18 / 1.152921504606847e+18
                                            );
                                  }
                                }
                                else {
                                  snprintf(local_58,0x40,"%.0fPi",local_18 / 1125899906842624.0);
                                }
                              }
                              else {
                                snprintf(local_58,0x40,"%.1fPi",local_18 / 1125899906842624.0);
                              }
                            }
                            else {
                              snprintf(local_58,0x40,"%.2fPi",local_18 / 1125899906842624.0);
                            }
                          }
                          else {
                            snprintf(local_58,0x40,"%.0fTi",local_18 / 1099511627776.0);
                          }
                        }
                        else {
                          snprintf(local_58,0x40,"%.1fTi",local_18 / 1099511627776.0);
                        }
                      }
                      else {
                        snprintf(local_58,0x40,"%.2fTi",local_18 / 1099511627776.0);
                      }
                    }
                    else {
                      snprintf(local_58,0x40,"%.0fGi",local_18 / 1073741824.0);
                    }
                  }
                  else {
                    snprintf(local_58,0x40,"%.1fGi",local_18 / 1073741824.0);
                  }
                }
                else {
                  snprintf(local_58,0x40,"%.2fGi",local_18 / 1073741824.0);
                }
              }
              else {
                snprintf(local_58,0x40,"%.0fMi",local_18 / 1048576.0);
              }
            }
            else {
              snprintf(local_58,0x40,"%.1fMi",local_18 / 1048576.0);
            }
          }
          else {
            snprintf(local_58,0x40,"%.2fMi",local_18 / 1048576.0);
          }
        }
        else {
          snprintf(local_58,0x40,"%.0fKi",local_18 / 1024.0);
        }
      }
      else {
        snprintf(local_58,0x40,"%.1fKi",local_18 / 1024.0);
      }
    }
    else {
      snprintf(local_58,0x40,"%.2fKi",local_18 / 1024.0);
    }
  }
  else {
    snprintf(local_58,0x40,"%ld",in_RSI);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,local_58,&local_89);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return in_RDI;
}

Assistant:

std::string formatIEC(int64_t s)
{
  double n = static_cast<double>(s);
  char buf[64];
  const double Ki = 1024.0;
  const double Mi = Ki * 1024.0;
  const double Gi = Mi * 1024.0;
  const double Ti = Gi * 1024.0;
  const double Pi = Ti * 1024.0;
  const double Ei = Pi * 1024.0;

  if (n < Ki)
    snprintf(buf, sizeof buf, "%" PRId64, s);
  else if (n < Ki*9.995)
    snprintf(buf, sizeof buf, "%.2fKi", n / Ki);
  else if (n < Ki*99.95)
    snprintf(buf, sizeof buf, "%.1fKi", n / Ki);
  else if (n < Ki*1023.5)
    snprintf(buf, sizeof buf, "%.0fKi", n / Ki);

  else if (n < Mi*9.995)
    snprintf(buf, sizeof buf, "%.2fMi", n / Mi);
  else if (n < Mi*99.95)
    snprintf(buf, sizeof buf, "%.1fMi", n / Mi);
  else if (n < Mi*1023.5)
    snprintf(buf, sizeof buf, "%.0fMi", n / Mi);

  else if (n < Gi*9.995)
    snprintf(buf, sizeof buf, "%.2fGi", n / Gi);
  else if (n < Gi*99.95)
    snprintf(buf, sizeof buf, "%.1fGi", n / Gi);
  else if (n < Gi*1023.5)
    snprintf(buf, sizeof buf, "%.0fGi", n / Gi);

  else if (n < Ti*9.995)
    snprintf(buf, sizeof buf, "%.2fTi", n / Ti);
  else if (n < Ti*99.95)
    snprintf(buf, sizeof buf, "%.1fTi", n / Ti);
  else if (n < Ti*1023.5)
    snprintf(buf, sizeof buf, "%.0fTi", n / Ti);

  else if (n < Pi*9.995)
    snprintf(buf, sizeof buf, "%.2fPi", n / Pi);
  else if (n < Pi*99.95)
    snprintf(buf, sizeof buf, "%.1fPi", n / Pi);
  else if (n < Pi*1023.5)
    snprintf(buf, sizeof buf, "%.0fPi", n / Pi);

  else if (n < Ei*9.995)
    snprintf(buf, sizeof buf, "%.2fEi", n / Ei );
  else
    snprintf(buf, sizeof buf, "%.1fEi", n / Ei );
  return buf;
}